

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloorPlanGraph.hpp
# Opt level: O0

void __thiscall
graphProperties::serialize<boost::archive::binary_oarchive>
          (graphProperties *this,binary_oarchive *ar,uint version)

{
  uint version_local;
  binary_oarchive *ar_local;
  graphProperties *this_local;
  
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->floorname);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->filepath);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->maxx);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->maxy);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->minx);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->minx);
  boost::archive::detail::interface_oarchive<boost::archive::binary_oarchive>::operator&
            ((interface_oarchive<boost::archive::binary_oarchive> *)ar,&this->centroid);
  return;
}

Assistant:

void serialize(Archive &ar, const unsigned int version)
        {

            ar & floorname;
            ar & filepath;
            ar & maxx;
            ar & maxy;
            ar & minx;
            ar & minx;
            ar & centroid;
        }